

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

void __thiscall
immutable::ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
          (ref<immutable::rrb_details::tree_node<int,_true>_> *this)

{
  atomic<unsigned_int> *paVar1;
  internal_node<int,_true> *p_node;
  
  p_node = (internal_node<int,_true> *)this->ptr;
  if (p_node != (internal_node<int,_true> *)0x0) {
    if (p_node->type == LEAF_NODE) {
      LOCK();
      paVar1 = &p_node->_ref_count;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(p_node);
        return;
      }
    }
    else {
      rrb_details::release<int>(p_node);
    }
  }
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }